

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::addImplications
          (HighsCliqueTable *this,HighsDomain *domain,HighsInt col,HighsInt val)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  CliqueVar CVar5;
  ulong uVar6;
  CliqueVar CVar7;
  double dVar8;
  HighsDomainChange boundchg;
  CliqueVar v;
  anon_class_40_5_13abfe59 doFixings;
  CliqueVar local_64;
  HighsInt local_60;
  HighsInt local_5c;
  anon_class_40_5_13abfe59 local_58;
  
  CVar5 = (CliqueVar)(val << 0x1f | col & 0x7fffffffU);
  iVar3 = (this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col & 0x7fffffffU];
  local_64 = CVar5;
  local_60 = val;
  local_5c = col;
  if (iVar3 != 0) {
    do {
      dVar8 = 1.0;
      CVar7 = (this->substitutions).
              super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)iVar3 + -1].replace;
      uVar4 = (uint)CVar5 & 0x80000000 ^ (uint)CVar7;
      CVar5 = (CliqueVar)(uVar4 ^ 0x80000000);
      local_64 = CVar5;
      if ((int)uVar4 < 0) {
        dVar8 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(uint)CVar5];
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          uVar6 = (ulong)(uint)CVar5 + 0x100000000;
          dVar8 = 0.0;
          goto LAB_002620cb;
        }
      }
      else {
        uVar6 = (ulong)((uint)CVar7 & 0x7fffffff);
        dVar1 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        if ((dVar1 != 1.0) || (NAN(dVar1))) {
LAB_002620cb:
          boundchg.column = (int)uVar6;
          boundchg.boundtype = (int)(uVar6 >> 0x20);
          boundchg.boundval = dVar8;
          HighsDomain::changeBound
                    (domain,boundchg,(Reason)((ulong)(uint)(val + col * 2) << 0x20 | 0xfffffffb));
          if (domain->infeasible_ != false) {
            return;
          }
        }
      }
      iVar3 = (this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(uint)CVar7 & 0x7fffffff];
    } while (iVar3 != 0);
  }
  local_58.v = &local_64;
  local_58.col = &local_5c;
  local_58.val = &local_60;
  local_58.this = this;
  local_58.domain = domain;
  bVar2 = HighsHashTree<int,_int>::
          for_each_recurse<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1871:20)_&,_0>
                    ((NodePtr)(this->invertedHashList).
                              super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start
                              [(int)((int)CVar5 << 1 | (uint)((int)CVar5 < 0))].root.ptrAndType,
                     &local_58);
  if (!bVar2) {
    HighsHashTree<int,_void>::
    for_each_recurse<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1871:20)_&,_0>
              ((NodePtr)(this->invertedHashListSizeTwo).
                        super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [(int)((int)local_64 << 1 | (uint)((int)local_64 < 0))].root.ptrAndType,
               &local_58);
  }
  return;
}

Assistant:

void HighsCliqueTable::addImplications(HighsDomain& domain, HighsInt col,
                                       HighsInt val) {
  CliqueVar v(col, val);

  while (colsubstituted[v.col]) {
    assert((HighsInt)substitutions.size() > colsubstituted[v.col] - 1);
    Substitution subst = substitutions[colsubstituted[v.col] - 1];
    v = v.val == 1 ? subst.replace : subst.replace.complement();
    if (v.val == 1) {
      if (domain.col_lower_[v.col] == 1.0) continue;

      domain.changeBound(HighsBoundType::kLower, v.col, 1.0,
                         HighsDomain::Reason::cliqueTable(col, val));
      if (domain.infeasible()) return;
    } else {
      if (domain.col_upper_[v.col] == 0.0) continue;

      domain.changeBound(HighsBoundType::kUpper, v.col, 0.0,
                         HighsDomain::Reason::cliqueTable(col, val));
      if (domain.infeasible()) return;
    }
  }

  auto doFixings = [&](HighsInt cliqueid) {
    HighsInt start = cliques[cliqueid].start;
    HighsInt end = cliques[cliqueid].end;

    for (HighsInt i = start; i != end; ++i) {
      if (cliqueentries[i].col == v.col) continue;

      if (cliqueentries[i].val == 1) {
        if (domain.col_upper_[cliqueentries[i].col] == 0.0) continue;

        domain.changeBound(HighsBoundType::kUpper, cliqueentries[i].col, 0.0,
                           HighsDomain::Reason::cliqueTable(col, val));
        if (domain.infeasible()) return true;
      } else {
        if (domain.col_lower_[cliqueentries[i].col] == 1.0) continue;

        domain.changeBound(HighsBoundType::kLower, cliqueentries[i].col, 1.0,
                           HighsDomain::Reason::cliqueTable(col, val));
        if (domain.infeasible()) return true;
      }
    }

    return false;
  };

  bool infeas = invertedHashList[v.index()].for_each(doFixings);

  if (infeas) return;

  invertedHashListSizeTwo[v.index()].for_each(doFixings);
}